

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O3

uint ncnn::get_elf_hwcap(uint type)

{
  int iVar1;
  undefined8 in_RAX;
  FILE *__stream;
  size_t sVar2;
  uint uVar3;
  anon_struct_8_2_05f151bc entry;
  undefined8 local_28;
  
  local_28 = in_RAX;
  __stream = fopen("/proc/self/auxv","rb");
  if (__stream == (FILE *)0x0) {
    get_elf_hwcap();
    uVar3 = 0;
  }
  else {
    while ((iVar1 = feof(__stream), uVar3 = 0, iVar1 == 0 &&
           (sVar2 = fread(&local_28,8,1,__stream), uVar3 = 0, (int)sVar2 == 1))) {
      if (((uint)local_28 == 0 && local_28._4_4_ == 0) ||
         (uVar3 = local_28._4_4_, (uint)local_28 == type)) break;
    }
    fclose(__stream);
  }
  return uVar3;
}

Assistant:

static unsigned int get_elf_hwcap(unsigned int type)
{
#if defined __ANDROID__
    unsigned int hwcap = get_elf_hwcap_from_getauxval(type);
    if (hwcap)
        return hwcap;
#endif

    return get_elf_hwcap_from_proc_self_auxv(type);
}